

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O1

string * cfd::js::api::json::JsonMappingApi::GetTapScriptTreeInfoByControlBlock
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
  local_48;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = AddressStructApi::GetTapScriptTreeInfoByControlBlock;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&),_cfd::js::api::TapScriptInfoStruct_(*)(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&),_cfd::js::api::TapScriptInfoStruct_(*)(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
       ::_M_manager;
  local_48.super__Function_base._M_functor._8_8_ = 0;
  local_48.super__Function_base._M_functor._M_unused._M_function_pointer =
       ElementsAddressStructApi::GetTapScriptTreeInfoByControlBlock;
  local_48._M_invoker =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&),_cfd::js::api::TapScriptInfoStruct_(*)(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
       ::_M_invoke;
  local_48.super__Function_base._M_manager =
       std::
       _Function_handler<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&),_cfd::js::api::TapScriptInfoStruct_(*)(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
       ::_M_manager;
  ExecuteElementsCheckApi<cfd::js::api::json::TapScriptInfoByControlRequest,cfd::js::api::json::TapScriptInfo,cfd::js::api::TapScriptInfoByControlRequestStruct,cfd::js::api::TapScriptInfoStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,&local_48,
             (function<cfd::js::api::TapScriptInfoStruct_(const_cfd::js::api::TapScriptInfoByControlRequestStruct_&)>
              *)ElementsAddressStructApi::GetTapScriptTreeInfoByControlBlock);
  if (local_48.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_48.super__Function_base._M_manager)
              ((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::GetTapScriptTreeInfoByControlBlock(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::TapScriptInfoByControlRequest, api::json::TapScriptInfo,
      api::TapScriptInfoByControlRequestStruct, api::TapScriptInfoStruct>(
      request_message, AddressStructApi::GetTapScriptTreeInfoByControlBlock,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressStructApi::GetTapScriptTreeInfoByControlBlock);
#else
      AddressStructApi::GetTapScriptTreeInfoByControlBlock);
#endif
}